

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O0

void dd::OutputDebugInfo(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1e8 [8];
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined4 local_138;
  undefined4 local_134;
  va_list args;
  char acStack_118 [8];
  char buf [256];
  char *format_local;
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Da;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_1e8;
  args[0]._0_8_ = &stack0x00000008;
  local_134 = 0x30;
  local_138 = 8;
  buf[0xe8] = '\0';
  buf[0xe9] = '\0';
  buf[0xea] = '\0';
  buf[0xeb] = '\0';
  buf[0xec] = '\0';
  buf[0xed] = '\0';
  buf[0xee] = '\0';
  buf[0xef] = '\0';
  buf[0xf0] = '\0';
  buf[0xf1] = '\0';
  buf[0xf2] = '\0';
  buf[0xf3] = '\0';
  buf[0xf4] = '\0';
  buf[0xf5] = '\0';
  buf[0xf6] = '\0';
  buf[0xf7] = '\0';
  buf[0xd8] = '\0';
  buf[0xd9] = '\0';
  buf[0xda] = '\0';
  buf[0xdb] = '\0';
  buf[0xdc] = '\0';
  buf[0xdd] = '\0';
  buf[0xde] = '\0';
  buf[0xdf] = '\0';
  buf[0xe0] = '\0';
  buf[0xe1] = '\0';
  buf[0xe2] = '\0';
  buf[0xe3] = '\0';
  buf[0xe4] = '\0';
  buf[0xe5] = '\0';
  buf[0xe6] = '\0';
  buf[0xe7] = '\0';
  buf[200] = '\0';
  buf[0xc9] = '\0';
  buf[0xca] = '\0';
  buf[0xcb] = '\0';
  buf[0xcc] = '\0';
  buf[0xcd] = '\0';
  buf[0xce] = '\0';
  buf[0xcf] = '\0';
  buf[0xd0] = '\0';
  buf[0xd1] = '\0';
  buf[0xd2] = '\0';
  buf[0xd3] = '\0';
  buf[0xd4] = '\0';
  buf[0xd5] = '\0';
  buf[0xd6] = '\0';
  buf[0xd7] = '\0';
  buf[0xb8] = '\0';
  buf[0xb9] = '\0';
  buf[0xba] = '\0';
  buf[0xbb] = '\0';
  buf[0xbc] = '\0';
  buf[0xbd] = '\0';
  buf[0xbe] = '\0';
  buf[0xbf] = '\0';
  buf[0xc0] = '\0';
  buf[0xc1] = '\0';
  buf[0xc2] = '\0';
  buf[0xc3] = '\0';
  buf[0xc4] = '\0';
  buf[0xc5] = '\0';
  buf[0xc6] = '\0';
  buf[199] = '\0';
  buf[0xa8] = '\0';
  buf[0xa9] = '\0';
  buf[0xaa] = '\0';
  buf[0xab] = '\0';
  buf[0xac] = '\0';
  buf[0xad] = '\0';
  buf[0xae] = '\0';
  buf[0xaf] = '\0';
  buf[0xb0] = '\0';
  buf[0xb1] = '\0';
  buf[0xb2] = '\0';
  buf[0xb3] = '\0';
  buf[0xb4] = '\0';
  buf[0xb5] = '\0';
  buf[0xb6] = '\0';
  buf[0xb7] = '\0';
  buf[0x98] = '\0';
  buf[0x99] = '\0';
  buf[0x9a] = '\0';
  buf[0x9b] = '\0';
  buf[0x9c] = '\0';
  buf[0x9d] = '\0';
  buf[0x9e] = '\0';
  buf[0x9f] = '\0';
  buf[0xa0] = '\0';
  buf[0xa1] = '\0';
  buf[0xa2] = '\0';
  buf[0xa3] = '\0';
  buf[0xa4] = '\0';
  buf[0xa5] = '\0';
  buf[0xa6] = '\0';
  buf[0xa7] = '\0';
  buf[0x88] = '\0';
  buf[0x89] = '\0';
  buf[0x8a] = '\0';
  buf[0x8b] = '\0';
  buf[0x8c] = '\0';
  buf[0x8d] = '\0';
  buf[0x8e] = '\0';
  buf[0x8f] = '\0';
  buf[0x90] = '\0';
  buf[0x91] = '\0';
  buf[0x92] = '\0';
  buf[0x93] = '\0';
  buf[0x94] = '\0';
  buf[0x95] = '\0';
  buf[0x96] = '\0';
  buf[0x97] = '\0';
  buf[0x78] = '\0';
  buf[0x79] = '\0';
  buf[0x7a] = '\0';
  buf[0x7b] = '\0';
  buf[0x7c] = '\0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  buf[0x80] = '\0';
  buf[0x81] = '\0';
  buf[0x82] = '\0';
  buf[0x83] = '\0';
  buf[0x84] = '\0';
  buf[0x85] = '\0';
  buf[0x86] = '\0';
  buf[0x87] = '\0';
  buf[0x68] = '\0';
  buf[0x69] = '\0';
  buf[0x6a] = '\0';
  buf[0x6b] = '\0';
  buf[0x6c] = '\0';
  buf[0x6d] = '\0';
  buf[0x6e] = '\0';
  buf[0x6f] = '\0';
  buf[0x70] = '\0';
  buf[0x71] = '\0';
  buf[0x72] = '\0';
  buf[0x73] = '\0';
  buf[0x74] = '\0';
  buf[0x75] = '\0';
  buf[0x76] = '\0';
  buf[0x77] = '\0';
  buf[0x58] = '\0';
  buf[0x59] = '\0';
  buf[0x5a] = '\0';
  buf[0x5b] = '\0';
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  buf[0x60] = '\0';
  buf[0x61] = '\0';
  buf[0x62] = '\0';
  buf[99] = '\0';
  buf[100] = '\0';
  buf[0x65] = '\0';
  buf[0x66] = '\0';
  buf[0x67] = '\0';
  buf[0x48] = '\0';
  buf[0x49] = '\0';
  buf[0x4a] = '\0';
  buf[0x4b] = '\0';
  buf[0x4c] = '\0';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  buf[0x50] = '\0';
  buf[0x51] = '\0';
  buf[0x52] = '\0';
  buf[0x53] = '\0';
  buf[0x54] = '\0';
  buf[0x55] = '\0';
  buf[0x56] = '\0';
  buf[0x57] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x40] = '\0';
  buf[0x41] = '\0';
  buf[0x42] = '\0';
  buf[0x43] = '\0';
  buf[0x44] = '\0';
  buf[0x45] = '\0';
  buf[0x46] = '\0';
  buf[0x47] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  acStack_118[0] = '\0';
  acStack_118[1] = '\0';
  acStack_118[2] = '\0';
  acStack_118[3] = '\0';
  acStack_118[4] = '\0';
  acStack_118[5] = '\0';
  acStack_118[6] = '\0';
  acStack_118[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  local_1e0 = in_RSI;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  vsnprintf(acStack_118,0x100,format,&local_138);
  printf("%s\r\n",acStack_118);
  return;
}

Assistant:

void OutputDebugInfo(const char* format, ...)
	{
		char buf[256];
		va_list args;
		va_start(args, format);
		memset(buf, 0, 256);
		vsnprintf(buf, 256, format, args);
		va_end(args);
#ifdef _WIN32
		OutputDebugStringA(buf);
	//	OutputDebugStringA("\r\n");
#else
		printf("%s\r\n", buf);
#endif
	}